

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printAssociativeContainer<QMap<QString,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,QMap<QString,_QVariant> *c)

{
  char *pcVar1;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar2;
  storage_type *psVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  QTextStream *pQVar6;
  storage_type *psVar7;
  _Base_ptr p_Var8;
  QArrayData *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QDebugStateSaver saver;
  QTextStream *local_60;
  undefined8 local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar6 = *(QTextStream **)debug.stream;
  pQVar6[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar7 = psVar3 + 1;
      pcVar1 = which + 1 + (long)psVar3;
      psVar3 = psVar7;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar7;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar6,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  QVar10.m_data = (storage_type *)0x1;
  QVar10.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar6,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar2 = (c->d).d.ptr;
  if (pQVar2 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var8 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var8 = (_Base_ptr)0x0;
  }
  if (p_Var4 != p_Var8) {
    do {
      QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      p_Var8 = p_Var4[1]._M_parent;
      if (p_Var8 == (_Base_ptr)0x0) {
        p_Var8 = (_Base_ptr)&QString::_empty;
      }
      QDebug::putString((QChar *)debug.stream,(ulong)p_Var8);
      pQVar6 = *(QTextStream **)debug.stream;
      if (pQVar6[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar6,' ');
        pQVar6 = *(QTextStream **)debug.stream;
      }
      QVar11.m_data = (storage_type *)0x2;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(pQVar6,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00 = *(QArrayData **)debug.stream;
      if ((char)this_00[3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)this_00,' ');
        this_00 = *(QArrayData **)debug.stream;
      }
      *(int *)&this_00[2].alloc = (int)this_00[2].alloc + 1;
      local_50.d.d = (Data *)this_00;
      QVariant::qdebugHelper((Stream *)&local_60);
      QDebug::~QDebug((QDebug *)&local_50);
      QTextStream::operator<<(local_60,')');
      if (local_60[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_60,' ');
      }
      QDebug::~QDebug((QDebug *)&local_60);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      pQVar2 = (c->d).d.ptr;
      p_Var5 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar2 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                     *)0x0) {
        p_Var5 = (_Rb_tree_node_base *)0x0;
      }
    } while (p_Var4 != p_Var5);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}